

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uchar *puVar1;
  uchar *puVar2;
  sqlite3 *db_00;
  uchar *z;
  char *z_00;
  sqlite3_context *in_RDI;
  sqlite3 *db;
  char *zRet;
  int len;
  uchar *zCsr;
  Token tname;
  int token;
  uchar *zTableName;
  uchar *zSql;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  int local_2c;
  
  puVar1 = sqlite3_value_text((sqlite3_value *)0x1afb8f);
  puVar2 = sqlite3_value_text((sqlite3_value *)0x1afba2);
  uVar4 = 0;
  z = puVar1;
  db_00 = sqlite3_context_db_handle(in_RDI);
  if (puVar1 != (uchar *)0x0) {
    do {
      puVar6 = z;
      uVar5 = uVar4;
      uVar4 = uVar5;
      z = puVar6;
      if (*puVar6 == '\0') {
        return;
      }
      do {
        z = z + (int)uVar4;
        uVar4 = sqlite3GetToken(z,(int *)CONCAT44(uVar4,in_stack_ffffffffffffffb0));
      } while (local_2c == 0x97);
      uVar3 = local_2c != 0x16 && local_2c != 0x7d;
    } while ((bool)uVar3);
    z_00 = sqlite3MPrintf(db_00,"%.*s\"%w\"%s",(ulong)(uint)((int)puVar6 - (int)puVar1),puVar1,
                          puVar2,puVar6 + uVar5);
    sqlite3_result_text((sqlite3_context *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),z_00,
                        (int)((ulong)db_00 >> 0x20),
                        (_func_void_void_ptr *)CONCAT17(uVar3,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  unsigned char const *zSql = sqlite3_value_text(argv[0]);
  unsigned char const *zTableName = sqlite3_value_text(argv[1]);

  int token;
  Token tname;
  unsigned char const *zCsr = zSql;
  int len = 0;
  char *zRet;

  sqlite3 *db = sqlite3_context_db_handle(context);

  UNUSED_PARAMETER(NotUsed);

  /* The principle used to locate the table name in the CREATE TABLE 
  ** statement is that the table name is the first non-space token that
  ** is immediately followed by a TK_LP or TK_USING token.
  */
  if( zSql ){
    do {
      if( !*zCsr ){
        /* Ran out of input before finding an opening bracket. Return NULL. */
        return;
      }

      /* Store the token that zCsr points to in tname. */
      tname.z = (char*)zCsr;
      tname.n = len;

      /* Advance zCsr to the next token. Store that token type in 'token',
      ** and its length in 'len' (to be used next iteration of this loop).
      */
      do {
        zCsr += len;
        len = sqlite3GetToken(zCsr, &token);
      } while( token==TK_SPACE );
      assert( len>0 );
    } while( token!=TK_LP && token!=TK_USING );

    zRet = sqlite3MPrintf(db, "%.*s\"%w\"%s", (int)(((u8*)tname.z) - zSql),
       zSql, zTableName, tname.z+tname.n);
    sqlite3_result_text(context, zRet, -1, SQLITE_DYNAMIC);
  }
}